

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

char * tinyformat::detail::printFormatStringLiteral(ostream *out,char *fmt)

{
  long lVar1;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *c;
  char *local_28;
  char *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RSI;
  for (local_28 = in_RSI; *local_28 != '\0'; local_28 = local_28 + 1) {
    if (*local_28 == '%') {
      std::ostream::write(in_RDI,(long)local_20);
      if (local_28[1] != '%') goto LAB_0033385c;
      local_28 = local_28 + 1;
      local_20 = local_28;
    }
  }
  std::ostream::write(in_RDI,(long)local_20);
LAB_0033385c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

inline const char* printFormatStringLiteral(std::ostream& out, const char* fmt)
{
    const char* c = fmt;
    for (;; ++c) {
        if (*c == '\0') {
            out.write(fmt, c - fmt);
            return c;
        }
        else if (*c == '%') {
            out.write(fmt, c - fmt);
            if (*(c+1) != '%')
                return c;
            // for "%%", tack trailing % onto next literal section.
            fmt = ++c;
        }
    }
}